

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::adjustSize(QWidget *this)

{
  QWidgetPrivate *this_00;
  QLayout *this_01;
  long in_FS_OFFSET;
  QSize s;
  QSize local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  ensurePolished(this);
  local_20 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QWidgetPrivate::adjustedSize(this_00);
  this_01 = this_00->layout;
  if (this_01 != (QLayout *)0x0) {
    QLayout::activate(this_01);
  }
  if ((-1 < local_20.wd.m_i) && (-1 < (long)local_20)) {
    resize(this,&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::adjustSize()
{
    Q_D(QWidget);
    ensurePolished();
    QSize s = d->adjustedSize();

    if (d->layout)
        d->layout->activate();

    if (s.isValid())
        resize(s);
}